

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

Type * __thiscall
JsUtil::
List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::AllocArray(List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *this,int size)

{
  undefined1 auVar1 [16];
  Type *pTVar2;
  Type *pTVar3;
  size_t byteSize;
  
  if (size != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pTVar2 = (Type *)new__<Memory::JitArenaAllocator>
                               (byteSize,(this->
                                         super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                                         ).alloc,0x3eba5c);
    pTVar3 = pTVar2;
    do {
      pTVar3->type = InlineeFrameInfoValueType_None;
      (pTVar3->field_1).sym = (StackSym *)0x0;
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar2 + size);
    return pTVar2;
  }
  return (Type *)&DAT_00000008;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}